

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::M68k::Primitive::multiply<true,CPU::MC68000::ProcessorBase>
               (uint16_t source,uint32_t *destination,Status *status,ProcessorBase *flow_controller)

{
  ProcessorBase *flow_controller_local;
  Status *status_local;
  uint32_t *destination_local;
  uint16_t source_local;
  
  *destination = (uint)source * (*destination & 0xffff);
  status->overflow_flag = 0;
  status->carry_flag = 0;
  Status::set_neg_zero<unsigned_int>(status,*destination);
  CPU::MC68000::ProcessorBase::did_mulu<unsigned_short>(flow_controller,source);
  return;
}

Assistant:

void multiply(uint16_t source, uint32_t &destination, Status &status, FlowController &flow_controller) {
	if constexpr (is_mulu) {
		destination = source * uint16_t(destination);
	} else {
		destination = u_extend16(source) * u_extend16(uint16_t(destination));
	}
	status.carry_flag = status.overflow_flag = 0;
	status.set_neg_zero(destination);

	if constexpr (is_mulu) {
		flow_controller.did_mulu(source);
	} else {
		flow_controller.did_muls(source);
	}
}